

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

And * __thiscall matchit::impl::IdBlock<mathiu::impl::And>::get(IdBlock<mathiu::impl::And> *this)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::And,_mathiu::impl::And_*,_const_mathiu::impl::And_*>_&>
  pAVar1;
  anon_class_1_0_00000001 local_15;
  anon_class_1_0_00000001 local_14;
  anon_class_1_0_00000001 local_13;
  anon_class_1_0_00000001 local_12;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:1189:33)>
  local_11;
  IdBlock<mathiu::impl::And> *local_10;
  IdBlock<mathiu::impl::And> *this_local;
  
  local_10 = this;
  overload<matchit::impl::IdBlock<mathiu::impl::And>::get()const::_lambda(mathiu::impl::And_const&)_1_,matchit::impl::IdBlock<mathiu::impl::And>::get()const::_lambda(mathiu::impl::And_const*)_1_,matchit::impl::IdBlock<mathiu::impl::And>::get()const::_lambda(mathiu::impl::And*)_1_,matchit::impl::IdBlock<mathiu::impl::And>::get()const::_lambda(std::monostate_const&)_1_>
            (&local_12,&local_13,&local_14,&local_15);
  pAVar1 = std::
           visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::And>::get()const::_lambda(mathiu::impl::And_const&)_1_,matchit::impl::IdBlock<mathiu::impl::And>::get()const::_lambda(mathiu::impl::And_const*)_1_,matchit::impl::IdBlock<mathiu::impl::And>::get()const::_lambda(mathiu::impl::And*)_1_,matchit::impl::IdBlock<mathiu::impl::And>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::And,mathiu::impl::And*,mathiu::impl::And_const*>const&>
                     (&local_11,&(this->super_IdBlockBase<mathiu::impl::And>).mVariant);
  return pAVar1;
}

Assistant:

constexpr decltype(auto) get() const
            {
                return std::visit(
                    overload([](Type const &v) -> Type const & { return v; },
                                [](Type const *p) -> Type const & { return *p; },
                                [](Type *p) -> Type const & { return *p; },
                                [](std::monostate const &) -> Type const & {
                                    throw std::logic_error("invalid state!");
                                }),
                    IdBlockBase<Type>::mVariant);
            }